

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall
ExprWriterTest_RelationalExprPrecedence_Test::~ExprWriterTest_RelationalExprPrecedence_Test
          (ExprWriterTest_RelationalExprPrecedence_Test *this)

{
  ExprWriterTest_RelationalExprPrecedence_Test *unaff_retaddr;
  
  ~ExprWriterTest_RelationalExprPrecedence_Test(unaff_retaddr);
  return;
}

Assistant:

TEST_F(ExprWriterTest, RelationalExprPrecedence) {
  auto n0 = MakeConst(0), n1 = MakeConst(1);
  auto e1 = MakeBinary(ex::ADD, MakeVariable(0), n1);
  auto e2 = MakeBinary(ex::ADD, MakeVariable(1), n1);
  CHECK_WRITE("if x1 + 1 < x2 + 1 then 1",
      MakeIf(MakeRelational(ex::LT, e1, e2), n1, n0));
  CHECK_WRITE("if x1 + 1 <= x2 + 1 then 1",
      MakeIf(MakeRelational(ex::LE, e1, e2), n1, n0));
  CHECK_WRITE("if x1 + 1 = x2 + 1 then 1",
      MakeIf(MakeRelational(ex::EQ, e1, e2), n1, n0));
  CHECK_WRITE("if x1 + 1 >= x2 + 1 then 1",
      MakeIf(MakeRelational(ex::GE, e1, e2), n1, n0));
  CHECK_WRITE("if x1 + 1 > x2 + 1 then 1",
      MakeIf(MakeRelational(ex::GT, e1, e2), n1, n0));
  CHECK_WRITE("if x1 + 1 != x2 + 1 then 1",
      MakeIf(MakeRelational(ex::NE, e1, e2), n1, n0));
}